

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 __thiscall RealTrafficConnection::SetRequType(RealTrafficConnection *this,positionTy *_pos)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  positionTy *ppVar9;
  double dVar10;
  double dVar11;
  positionTy posUser;
  positionTy local_68;
  
  ppVar9 = &(this->curr).pos;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    ppVar9->_lat = _pos->_lat;
    _pos = (positionTy *)&_pos->_lon;
    ppVar9 = (positionTy *)&ppVar9->_lon;
  }
  (this->curr).tOff = 0;
  if (dataRefs.rtSTC == STC_SIM_TIME_PLUS_BUFFER) {
    iVar2 = XPLMGetDatai();
    if (iVar2 == 0) {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(dataRefs.lastXPSimTime_ms),8);
      tVar3 = time((time_t *)0x0);
      lVar7 = (tVar3 + ((lVar6 >> 7) - (lVar6 >> 0x3f))) - (long)dataRefs.fdBufPeriod;
      lVar6 = lVar7 / 0x3c;
      if (lVar7 < -0x3b) {
        lVar6 = 0;
      }
    }
    else {
      lVar6 = 0;
    }
LAB_00193921:
    (this->curr).tOff = lVar6;
  }
  else if (dataRefs.rtSTC == STC_SIM_TIME_MANUALLY) {
    lVar6 = (long)dataRefs.rtManTOfs;
    goto LAB_00193921;
  }
  iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [4])(this);
  if ((char)iVar2 == '\0') {
    (this->curr).eRequType = RT_REQU_DEAUTH;
LAB_00193974:
    tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )tVar4.__d.__r;
  }
  if ((this->curr).sGUID._M_string_length == 0) {
    (this->curr).eRequType = RT_REQU_AUTH;
    goto LAB_00193974;
  }
  if ((this->curr).eRequType == RT_REQU_NEAREST_METAR) {
    (this->curr).eRequType = RT_REQU_WEATHER;
    return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )(duration)(this->tNextWeather).__d.__r;
  }
  DataRefs::GetUsersPlanePos(&local_68,&dataRefs,(double *)0x0,(double *)0x0,(double *)0x0);
  if ((this->rtWx).nErr < 5) {
    if (!NAN((this->rtWx).QNH)) {
      uVar5 = (this->curr).tOff - (this->rtWx).tOff;
      uVar8 = -uVar5;
      if (0 < (long)uVar5) {
        uVar8 = uVar5;
      }
      if (((uVar8 < 0x79) &&
          (dVar10 = DistLatLonSqr((this->rtWx).pos._lat,(this->rtWx).pos._lon,local_68._lat,
                                  local_68._lon),
          dVar11 = (double)(dataRefs.weatherMaxMETARdist_nm * 0x73c) * 0.5,
          dVar10 <= dVar11 * dVar11)) &&
         (dVar10 = HeadingDiff((this->rtWx).pos._head,local_68._head), ABS(dVar10) <= 45.0)) {
        if (((this->rtWx).nErr < 5) &&
           (lVar6 = std::chrono::_V2::steady_clock::now(), (this->rtWx).next.__d.__r <= lVar6)) {
          (this->curr).eRequType = RT_REQU_WEATHER;
          lVar6 = 0x2a0;
          goto LAB_00193acb;
        }
        goto LAB_00193a9e;
      }
    }
    (this->curr).eRequType = RT_REQU_NEAREST_METAR;
    uVar5 = (this->curr).tOff - (this->rtWx).tOff;
    uVar8 = -uVar5;
    if (0 < (long)uVar5) {
      uVar8 = uVar5;
    }
    lVar6 = 0x2a0;
    if (0x78 < uVar8) {
      (this->rtWx).QNH = NAN;
    }
  }
  else {
LAB_00193a9e:
    if ((this->bDoParkedTraffic == true) && (bVar1 = LTAptAvailable(), bVar1)) {
      (this->curr).eRequType = RT_REQU_PARKED;
    }
    else {
      (this->curr).eRequType = RT_REQU_TRAFFIC;
    }
    lVar6 = 0x298;
  }
LAB_00193acb:
  return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )(duration)
           *(rep *)((long)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                           _vptr_LTChannel + lVar6);
}

Assistant:

std::chrono::time_point<std::chrono::steady_clock> RealTrafficConnection::SetRequType (const positionTy& _pos)
{
    // Position as passed in
    curr.pos = _pos;
    
    // Time offset: in minutes compared to now
    curr.tOff = 0L;
    switch (dataRefs.GetRTSTC()) {
        case STC_NO_CTRL:                           // don't send any ofset ever
            curr.tOff = 0L;
            break;
            
        case STC_SIM_TIME_MANUALLY:                 // send what got configured manually
            curr.tOff = dataRefs.GetRTManTOfs();
            break;
            
        case STC_SIM_TIME_PLUS_BUFFER:              // Send as per current simulation time
            if (dataRefs.IsUsingSystemTime()) {     // Using system time means: No ofset
                curr.tOff = 0;
            } else {
                // Simulated 'now' in seconds since the epoch
                const time_t simNow = time_t(dataRefs.GetXPSimTime_ms() / 1000LL);
                const time_t now = time(nullptr);
                // offset between older 'simNow' and current 'now' in minutes, minus buffering period
                curr.tOff = long(now - simNow - dataRefs.GetFdBufPeriod()) / 60L;
                // must be positive
                if (curr.tOff < 0) curr.tOff = 0;
            }
            break;
    }
    
    if (!shallRun()) {                                          // end the session?
        curr.eRequType = CurrTy::RT_REQU_DEAUTH;
        return std::chrono::steady_clock::now();
    }
    if (curr.sGUID.empty()) {                                   // have no GUID? Need authentication
        curr.eRequType = CurrTy::RT_REQU_AUTH;
        return std::chrono::steady_clock::now();
    }
    if (curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR) {      // previous request was METAR location?
        curr.eRequType = CurrTy::RT_REQU_WEATHER;
        return tNextWeather;
    }
    const positionTy posUser = dataRefs.GetUsersPlanePos();     // Where is the user's plane just now=
    if (rtWx.nErr < RT_DRCT_MAX_WX_ERR &&                       // not yet seen too many weather request errors? _AND_
        (std::isnan(rtWx.QNH) ||                                // no Weather, or wrong time offset, or outdated, or moved too far away?
         std::labs(curr.tOff - rtWx.tOff) > 120 ||
         // too far? (we use half the max. METAR distance
         rtWx.pos.distRoughSqr(posUser) > (sqr(dataRefs.GetWeatherMaxMetarDist_m()/2.0)) ||
         // or turned by at least 45 degrees? (Heading into a different direction can mean to select a different METAR)
         std::abs(HeadingDiff(rtWx.pos.heading(), posUser.heading())) > 45.0))
    {
        curr.eRequType = CurrTy::RT_REQU_NEAREST_METAR;
        if (std::labs(curr.tOff - rtWx.tOff) > 120)             // if changing the timeoffset (request other historic data) then we must have new weather before proceeding
            rtWx.QNH = NAN;
        return tNextWeather;
    }
    if (rtWx.nErr < RT_DRCT_MAX_WX_ERR &&                       // not yet seen too many weather request errors? _AND_
        std::chrono::steady_clock::now() >= rtWx.next)          // just time for a weather update
    {
        curr.eRequType = CurrTy::RT_REQU_WEATHER;
        return tNextWeather;
    }
    if (bDoParkedTraffic && LTAptAvailable()) {                 // Do the parked traffic now, and only when airport details are available so we can place the aircraft correctly
        curr.eRequType = CurrTy::RT_REQU_PARKED;
        return tNextTraffic;
    }
    
    // in all other cases we ask for traffic data
    curr.eRequType = CurrTy::RT_REQU_TRAFFIC;
    return tNextTraffic;
}